

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_assignment_helper
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool is_move)

{
  bool bVar1;
  int iVar2;
  e_req eVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference pptVar5;
  string *psVar6;
  t_type *ttype;
  bool local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_a8;
  t_field **local_a0;
  byte local_91;
  const_iterator cStack_90;
  bool has_nonrequired_fields;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string tmp_name;
  bool is_move_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  tmp_name.field_2._M_local_buf[0xf] = is_move;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"other",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  poVar4 = t_generator::indent((t_generator *)this,out);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
  poVar4 = std::operator<<(poVar4,"& ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
  std::operator<<(poVar4,"::operator=(");
  if ((tmp_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    poVar4 = std::operator<<(out,"const ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_02,iVar2));
    std::operator<<(poVar4,"& ");
  }
  else {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(out,(string *)CONCAT44(extraout_var_01,iVar2));
    std::operator<<(poVar4,"&& ");
  }
  poVar4 = std::operator<<(out,(string *)local_48);
  std::operator<<(poVar4,") ");
  if (((tmp_name.field_2._M_local_buf[0xf] & 1U) != 0) ||
     (bVar1 = is_struct_storage_not_throwing(this,tstruct), bVar1)) {
    std::operator<<(out,"noexcept ");
  }
  poVar4 = std::operator<<(out,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
  if (bVar1) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"(void) ");
    poVar4 = std::operator<<(poVar4,(string *)local_48);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffff70);
  local_91 = 0;
  local_a0 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_90 = (const_iterator)local_a0;
  while( true ) {
    local_a8._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff70,&local_a8);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff70);
    eVar3 = t_field::get_req(*pptVar5);
    if (eVar3 != T_REQUIRED) {
      local_91 = 1;
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff70);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4," = ");
    std::operator+(&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,"."
                  );
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff70);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::operator+(&local_e8,&local_108,psVar6);
    local_229 = false;
    if ((tmp_name.field_2._M_local_buf[0xf] & 1U) != 0) {
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff70);
      ttype = t_field::get_type(*pptVar5);
      local_229 = is_complex_type(this,ttype);
    }
    anon_unknown.dwarf_a45e4::maybeMove(&local_c8,&local_e8,local_229);
    poVar4 = std::operator<<(poVar4,(string *)&local_c8);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffff70);
  }
  if ((local_91 & 1) != 0) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"__isset = ");
    std::operator+(&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   ".__isset");
    anon_unknown.dwarf_a45e4::maybeMove(&local_128,&local_148,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_128);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"return *this;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_cpp_generator::generate_assignment_helper(ostream& out, t_struct* tstruct, bool is_move) {
  std::string tmp_name = tmp("other");

  indent(out) << tstruct->get_name() << "& " << tstruct->get_name() << "::operator=(";

  if (is_move) {
    out << tstruct->get_name() << "&& ";
  } else {
    out << "const " << tstruct->get_name() << "& ";
  }
  out << tmp_name << ") ";
  if(is_move || is_struct_storage_not_throwing(tstruct))
    out << "noexcept ";
  out << "{" << endl;
  indent_up();

  const vector<t_field*>& members = tstruct->get_members();

  // eliminate compiler unused warning
  if (members.empty())
    indent(out) << "(void) " << tmp_name << ";" << endl;

  vector<t_field*>::const_iterator f_iter;
  bool has_nonrequired_fields = false;
  for (f_iter = members.begin(); f_iter != members.end(); ++f_iter) {
    if ((*f_iter)->get_req() != t_field::T_REQUIRED)
      has_nonrequired_fields = true;
    indent(out) << (*f_iter)->get_name() << " = "
                << maybeMove(
                    tmp_name + "." + (*f_iter)->get_name(), 
                    is_move && is_complex_type((*f_iter)->get_type()))
                << ";" << endl;
  }
  if (has_nonrequired_fields) {
    indent(out) << "__isset = " << maybeMove(tmp_name + ".__isset", false) << ";" << endl;
  }

  indent(out) << "return *this;" << endl;
  indent_down();
  indent(out) << "}" << endl;
}